

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuHeapD.c
# Opt level: O0

Fxu_Double * Fxu_HeapDoubleGetMax(Fxu_HeapDouble *p)

{
  int iVar1;
  Fxu_Double *pDiv;
  Fxu_HeapDouble *p_local;
  
  if (p->nItems == 0) {
    p_local = (Fxu_HeapDouble *)0x0;
  }
  else {
    p_local = (Fxu_HeapDouble *)p->pTree[1];
    ((Fxu_Double *)p_local)->HNum = 0;
    iVar1 = p->nItems;
    p->nItems = iVar1 + -1;
    p->pTree[1] = p->pTree[iVar1];
    p->pTree[1]->HNum = 1;
    Fxu_HeapDoubleMoveDn(p,p->pTree[1]);
  }
  return (Fxu_Double *)p_local;
}

Assistant:

Fxu_Double * Fxu_HeapDoubleGetMax( Fxu_HeapDouble * p )
{
    Fxu_Double * pDiv;
    if ( p->nItems == 0 )
        return NULL;
    // prepare the return value
    pDiv = p->pTree[1];
    pDiv->HNum = 0;
    // put the last entry on top
    // decrement the number of entries
    p->pTree[1] = p->pTree[p->nItems--];
    p->pTree[1]->HNum = 1;
    // move the top entry down if necessary
    Fxu_HeapDoubleMoveDn( p, p->pTree[1] );
    return pDiv;     
}